

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

uint64_t __thiscall ImgfsFile::index2entryofs(ImgfsFile *this,uint ix)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  reference pvVar5;
  uint dirblockix;
  uint dirblocknr;
  uint ix_local;
  ImgfsFile *this_local;
  
  uVar2 = ix / (this->_hdr).entriesperblock;
  uVar1 = (this->_hdr).entriesperblock;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_dir2file);
  if (sVar3 <= uVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "unknown dirblock";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->_dir2file,(ulong)uVar2);
  return (ulong)(*pvVar5 * (this->_hdr).bytesperblock + 8 + (ix % uVar1) * (this->_hdr).direntsize);
}

Assistant:

uint64_t index2entryofs(unsigned ix)
    {
        unsigned dirblocknr= ix/_hdr.entriesperblock;
        unsigned dirblockix= ix%_hdr.entriesperblock;
        if (dirblocknr>=_dir2file.size())
            throw "unknown dirblock";

        //printf("i2entofs [ix=%d], blocknr=%d, blockix=%d -> fileblock=%d -> ofs=%08llx\n", ix, dirblocknr, dirblockix, _dir2file[dirblocknr], uint64_t(_dir2file[dirblocknr])*_hdr.bytesperblock+8+dirblockix*_hdr.direntsize);
        return _dir2file[dirblocknr]*_hdr.bytesperblock+8+dirblockix*_hdr.direntsize;
    }